

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generator.cc
# Opt level: O0

string * google::protobuf::compiler::StripProto(string *__return_storage_ptr__,string *filename)

{
  string *str;
  bool bVar1;
  allocator local_91;
  string local_90;
  allocator local_59;
  string local_58;
  StringPiece local_38;
  StringPiece local_28;
  string *local_18;
  string *filename_local;
  
  local_18 = filename;
  filename_local = __return_storage_ptr__;
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_28,filename);
  stringpiece_internal::StringPiece::StringPiece(&local_38,".protodevel");
  bVar1 = HasSuffixString(local_28,local_38);
  str = local_18;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,".protodevel",&local_59);
    StripSuffixString(__return_storage_ptr__,str,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,".proto",&local_91);
    StripSuffixString(__return_storage_ptr__,str,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StripProto(const std::string& filename) {
  if (HasSuffixString(filename, ".protodevel")) {
    return StripSuffixString(filename, ".protodevel");
  } else {
    return StripSuffixString(filename, ".proto");
  }
}